

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_2::NegativeCompileInterpolationCase::init
          (NegativeCompileInterpolationCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  ContextInfo *this_00;
  RenderContext *pRVar2;
  NotSupportedError *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  MessageBuilder local_1a8;
  deUint32 local_18;
  ContextType local_14;
  NegativeCompileInterpolationCase *local_10;
  NegativeCompileInterpolationCase *this_local;
  
  local_10 = this;
  this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_shader_multisample_interpolation");
  if (!bVar1) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Test requires GL_OES_shader_multisample_interpolation extension",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                 ,0x5ca);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_02 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1a8,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  this_03 = tcu::MessageBuilder::operator<<
                      (&local_1a8,
                       (char (*) [61])"Trying to compile illegal shader, expecting compile to fail."
                      );
  tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return extraout_EAX;
}

Assistant:

void NegativeCompileInterpolationCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_shader_multisample_interpolation extension");

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to compile illegal shader, expecting compile to fail." << tcu::TestLog::EndMessage;
}